

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O3

GLFWwindow *
glfwCreateWindow(int width,int height,char *title,GLFWmonitor *monitor,GLFWwindow *share)

{
  GLboolean GVar1;
  byte bVar2;
  wchar_t wVar3;
  _GLFWwindow *window;
  _GLFWwindow *window_00;
  char *format;
  int iVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int height_1;
  int width_1;
  _GLFWwndconfig local_f0;
  int local_d0;
  int local_cc;
  undefined1 local_c8 [16];
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  undefined1 local_a8 [88];
  int local_50;
  undefined1 local_4c;
  undefined1 local_4b;
  undefined8 local_48;
  int local_40;
  GLFWwindow *local_38;
  
  if (_glfwInitialized == '\0') {
    iVar4 = 0x10001;
    format = (char *)0x0;
  }
  else {
    if (0 < width && 0 < height) {
      local_a8._12_4_ = _glfw.hints.alphaBits;
      local_a8._8_4_ = _glfw.hints.blueBits;
      local_a8._0_8_ = _glfw.hints._0_8_;
      local_a8._16_8_ = _glfw.hints._16_8_;
      local_a8._24_8_ = _glfw.hints._24_8_;
      local_a8._32_8_ = _glfw.hints._32_8_;
      local_a8._40_4_ = _glfw.hints.auxBuffers;
      local_a8._56_4_ = ZEXT14(_glfw.hints.doublebuffer != 0);
      local_b8 = _glfw.hints.resizable;
      iStack_b4 = _glfw.hints.visible;
      iStack_b0 = _glfw.hints.decorated;
      iStack_ac = _glfw.hints.focused;
      local_c8._0_4_ = -(uint)(_glfw.hints.resizable == 0);
      local_c8._4_4_ = -(uint)(_glfw.hints.visible == 0);
      local_c8._8_4_ = -(uint)(_glfw.hints.decorated == 0);
      local_c8._12_4_ = -(uint)(_glfw.hints.focused == 0);
      auVar7 = packssdw(local_c8,local_c8);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar7 = packsswb(auVar8 ^ auVar7,auVar8 ^ auVar7);
      local_f0._16_4_ = auVar7._0_4_ & (uint)DAT_00232cb0;
      bVar5 = _glfw.hints.autoIconify != 0;
      local_a8._44_4_ = ZEXT14(_glfw.hints.stereo != 0);
      bVar6 = _glfw.hints.floating != 0;
      local_a8._48_8_ = _glfw.hints._72_8_;
      local_a8._80_8_ = _glfw.hints._88_8_;
      local_4c = _glfw.hints.forward != 0;
      local_50 = _glfw.hints.minor;
      local_4b = _glfw.hints.debug != 0;
      local_48 = _glfw.hints._108_8_;
      local_40 = _glfw.hints.release;
      local_f0.width = width;
      local_f0.height = height;
      local_f0.title = title;
      local_f0.autoIconify = bVar5;
      local_f0.floating = bVar6;
      local_f0.monitor = (_GLFWmonitor *)monitor;
      local_38 = share;
      GVar1 = _glfwIsValidContextConfig((_GLFWctxconfig *)(local_a8 + 0x50));
      if (GVar1 != '\0') {
        window = (_GLFWwindow *)calloc(1,0x2c0);
        window->next = _glfw.windowListHead;
        _glfw.windowListHead = window;
        if (monitor == (GLFWmonitor *)0x0) {
          bVar2 = ~local_c8[0] & 1;
        }
        else {
          local_f0._16_2_ = 0x101;
          local_f0.focused = 1;
          (window->videoMode).width = width;
          (window->videoMode).height = height;
          iVar4 = _glfw.hints.greenBits;
          (window->videoMode).redBits = _glfw.hints.redBits;
          (window->videoMode).greenBits = iVar4;
          (window->videoMode).blueBits = _glfw.hints.blueBits;
          (window->videoMode).refreshRate = _glfw.hints.refreshRate;
          bVar2 = 1;
        }
        window->monitor = (_GLFWmonitor *)monitor;
        window->resizable = bVar2;
        window->decorated = (-(iStack_b0 == 0) ^ 0xffU) & 1;
        window->autoIconify = bVar5;
        window->floating = bVar6;
        window->cursorMode = 0x34001;
        window_00 = _glfwPlatformGetCurrentContext();
        wVar3 = _glfwPlatformCreateWindow
                          (window,&local_f0,(_GLFWctxconfig *)(local_a8 + 0x50),
                           (_GLFWfbconfig *)local_a8);
        if (wVar3 != L'\0') {
          _glfwPlatformMakeContextCurrent(window);
          GVar1 = _glfwRefreshContextAttribs((_GLFWctxconfig *)(local_a8 + 0x50));
          if ((GVar1 != '\0') &&
             (GVar1 = _glfwIsValidContext((_GLFWctxconfig *)(local_a8 + 0x50)), GVar1 != '\0')) {
            glClear(0x4000);
            _glfwPlatformSwapBuffers(window);
            _glfwPlatformMakeContextCurrent(window_00);
            if (local_f0.monitor != (_GLFWmonitor *)0x0) {
              _glfwPlatformGetWindowSize(window,&local_cc,&local_d0);
              window->cursorPosX = (double)(local_cc / 2);
              window->cursorPosY = (double)(local_d0 / 2);
              _glfwPlatformSetCursorPos(window,(double)(local_cc / 2),(double)(local_d0 / 2));
              return (GLFWwindow *)window;
            }
            if (local_f0.visible == '\0') {
              return (GLFWwindow *)window;
            }
            if (local_f0.focused != '\0') {
              _glfwPlatformShowWindow(window);
              return (GLFWwindow *)window;
            }
            _glfwPlatformUnhideWindow(window);
            return (GLFWwindow *)window;
          }
        }
        glfwDestroyWindow((GLFWwindow *)window);
        _glfwPlatformMakeContextCurrent(window_00);
      }
      return (GLFWwindow *)0x0;
    }
    format = "Invalid window size";
    iVar4 = 0x10004;
  }
  _glfwInputError(iVar4,format);
  return (GLFWwindow *)0x0;
}

Assistant:

GLFWAPI GLFWwindow* glfwCreateWindow(int width, int height,
                                     const char* title,
                                     GLFWmonitor* monitor,
                                     GLFWwindow* share)
{
    _GLFWfbconfig fbconfig;
    _GLFWctxconfig ctxconfig;
    _GLFWwndconfig wndconfig;
    _GLFWwindow* window;
    _GLFWwindow* previous;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (width <= 0 || height <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid window size");
        return NULL;
    }

    // Set up desired framebuffer config
    fbconfig.redBits        = _glfw.hints.redBits;
    fbconfig.greenBits      = _glfw.hints.greenBits;
    fbconfig.blueBits       = _glfw.hints.blueBits;
    fbconfig.alphaBits      = _glfw.hints.alphaBits;
    fbconfig.depthBits      = _glfw.hints.depthBits;
    fbconfig.stencilBits    = _glfw.hints.stencilBits;
    fbconfig.accumRedBits   = _glfw.hints.accumRedBits;
    fbconfig.accumGreenBits = _glfw.hints.accumGreenBits;
    fbconfig.accumBlueBits  = _glfw.hints.accumBlueBits;
    fbconfig.accumAlphaBits = _glfw.hints.accumAlphaBits;
    fbconfig.auxBuffers     = _glfw.hints.auxBuffers;
    fbconfig.stereo         = _glfw.hints.stereo ? GL_TRUE : GL_FALSE;
    fbconfig.samples        = _glfw.hints.samples;
    fbconfig.sRGB           = _glfw.hints.sRGB;
    fbconfig.doublebuffer   = _glfw.hints.doublebuffer ? GL_TRUE : GL_FALSE;

    // Set up desired window config
    wndconfig.width         = width;
    wndconfig.height        = height;
    wndconfig.title         = title;
    wndconfig.resizable     = _glfw.hints.resizable ? GL_TRUE : GL_FALSE;
    wndconfig.visible       = _glfw.hints.visible ? GL_TRUE : GL_FALSE;
    wndconfig.decorated     = _glfw.hints.decorated ? GL_TRUE : GL_FALSE;
    wndconfig.focused       = _glfw.hints.focused ? GL_TRUE : GL_FALSE;
    wndconfig.autoIconify   = _glfw.hints.autoIconify ? GL_TRUE : GL_FALSE;
    wndconfig.floating      = _glfw.hints.floating ? GL_TRUE : GL_FALSE;
    wndconfig.monitor       = (_GLFWmonitor*) monitor;

    // Set up desired context config
    ctxconfig.api           = _glfw.hints.api;
    ctxconfig.major         = _glfw.hints.major;
    ctxconfig.minor         = _glfw.hints.minor;
    ctxconfig.forward       = _glfw.hints.forward ? GL_TRUE : GL_FALSE;
    ctxconfig.debug         = _glfw.hints.debug ? GL_TRUE : GL_FALSE;
    ctxconfig.profile       = _glfw.hints.profile;
    ctxconfig.robustness    = _glfw.hints.robustness;
    ctxconfig.release       = _glfw.hints.release;
    ctxconfig.share         = (_GLFWwindow*) share;

    // Check the OpenGL bits of the window config
    if (!_glfwIsValidContextConfig(&ctxconfig))
        return NULL;

    window = calloc(1, sizeof(_GLFWwindow));
    window->next = _glfw.windowListHead;
    _glfw.windowListHead = window;

    if (wndconfig.monitor)
    {
        wndconfig.resizable = GL_TRUE;
        wndconfig.visible   = GL_TRUE;
        wndconfig.focused   = GL_TRUE;

        // Set up desired video mode
        window->videoMode.width       = width;
        window->videoMode.height      = height;
        window->videoMode.redBits     = _glfw.hints.redBits;
        window->videoMode.greenBits   = _glfw.hints.greenBits;
        window->videoMode.blueBits    = _glfw.hints.blueBits;
        window->videoMode.refreshRate = _glfw.hints.refreshRate;
    }

    // Transfer window hints that are persistent settings and not
    // just initial states
    window->monitor     = wndconfig.monitor;
    window->resizable   = wndconfig.resizable;
    window->decorated   = wndconfig.decorated;
    window->autoIconify = wndconfig.autoIconify;
    window->floating    = wndconfig.floating;
    window->cursorMode  = GLFW_CURSOR_NORMAL;

    // Save the currently current context so it can be restored later
    previous = _glfwPlatformGetCurrentContext();

    // Open the actual window and create its context
    if (!_glfwPlatformCreateWindow(window, &wndconfig, &ctxconfig, &fbconfig))
    {
        glfwDestroyWindow((GLFWwindow*) window);
        _glfwPlatformMakeContextCurrent(previous);
        return NULL;
    }

    _glfwPlatformMakeContextCurrent(window);

    // Retrieve the actual (as opposed to requested) context attributes
    if (!_glfwRefreshContextAttribs(&ctxconfig))
    {
        glfwDestroyWindow((GLFWwindow*) window);
        _glfwPlatformMakeContextCurrent(previous);
        return NULL;
    }

    // Verify the context against the requested parameters
    if (!_glfwIsValidContext(&ctxconfig))
    {
        glfwDestroyWindow((GLFWwindow*) window);
        _glfwPlatformMakeContextCurrent(previous);
        return NULL;
    }

    // Clearing the front buffer to black to avoid garbage pixels left over
    // from previous uses of our bit of VRAM
    glClear(GL_COLOR_BUFFER_BIT);
    _glfwPlatformSwapBuffers(window);

    // Restore the previously current context (or NULL)
    _glfwPlatformMakeContextCurrent(previous);

    if (wndconfig.monitor)
    {
        int width, height;
        _glfwPlatformGetWindowSize(window, &width, &height);

        window->cursorPosX = width / 2;
        window->cursorPosY = height / 2;

        _glfwPlatformSetCursorPos(window, window->cursorPosX, window->cursorPosY);
    }
    else
    {
        if (wndconfig.visible)
        {
            if (wndconfig.focused)
                _glfwPlatformShowWindow(window);
            else
                _glfwPlatformUnhideWindow(window);
        }
    }

    return (GLFWwindow*) window;
}